

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_invert(matrix3 *self)

{
  matrix3 *pmVar1;
  long lVar2;
  matrix3 *pmVar3;
  byte bVar4;
  matrix3 inverse;
  matrix3 local_50;
  
  bVar4 = 0;
  pmVar1 = matrix3_inverse(self,&local_50);
  if (pmVar1 != (matrix3 *)0x0) {
    pmVar1 = &local_50;
    pmVar3 = self;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pmVar3->field_0).m[0] = (pmVar1->field_0).m[0];
      pmVar1 = (matrix3 *)((long)pmVar1 + ((ulong)bVar4 * -2 + 1) * 8);
      pmVar3 = (matrix3 *)((long)pmVar3 + (ulong)bVar4 * -0x10 + 8);
    }
  }
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_invert(struct matrix3 *self)
{
	struct matrix3 inverse;
	uint8_t i;

	if (matrix3_inverse(self, &inverse)) {
		for (i = 0; i < 9; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}